

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalArrayBuffer.cpp
# Opt level: O0

ArrayBufferDetachedStateBase * __thiscall
Js::JsrtExternalArrayBuffer::CreateDetachedState
          (JsrtExternalArrayBuffer *this,RefCountedBuffer *buffer,uint32 bufferLength)

{
  HeapAllocator *alloc;
  JsrtExternalArrayBufferDetachedState *this_00;
  TrackAllocData local_48;
  uint32 local_1c;
  RefCountedBuffer *pRStack_18;
  uint32 bufferLength_local;
  RefCountedBuffer *buffer_local;
  JsrtExternalArrayBuffer *this_local;
  
  local_1c = bufferLength;
  pRStack_18 = buffer;
  buffer_local = (RefCountedBuffer *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&JsrtExternalArrayBufferDetachedState::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalArrayBuffer.cpp"
             ,0x2c);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  this_00 = (JsrtExternalArrayBufferDetachedState *)new<Memory::HeapAllocator>(0x30,alloc,0x350bd0);
  JsrtExternalArrayBufferDetachedState::JsrtExternalArrayBufferDetachedState
            (this_00,pRStack_18,local_1c,this->finalizeCallback,this->callbackState);
  return (ArrayBufferDetachedStateBase *)this_00;
}

Assistant:

ArrayBufferDetachedStateBase* JsrtExternalArrayBuffer::CreateDetachedState(RefCountedBuffer* buffer, DECLSPEC_GUARD_OVERFLOW uint32 bufferLength)
    {
        return HeapNew(JsrtExternalArrayBufferDetachedState, buffer, bufferLength, finalizeCallback, callbackState);
    }